

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O1

Quat rw::lerp(Quat *q,Quat *p,float32 r)

{
  ulong uVar1;
  float fVar2;
  ulong uVar3;
  float fVar4;
  Quat QVar5;
  
  uVar3._0_4_ = q->x;
  uVar3._4_4_ = q->y;
  uVar1._0_4_ = q->z;
  uVar1._4_4_ = q->w;
  if ((float)(undefined4)uVar1 * (float)p->z +
      (float)uVar3._4_4_ * (float)p->y +
      (float)uVar1._4_4_ * (float)p->w + (float)(undefined4)uVar3 * (float)p->x < 0.0) {
    uVar3 = uVar3 ^ 0x8000000080000000;
    uVar1 = uVar1 ^ 0x8000000080000000;
  }
  fVar2 = (float)(uVar1 >> 0x20);
  fVar4 = (float)(uVar3 >> 0x20);
  QVar5.z = ((float)p->z - (float)uVar1) * (float)r + (float)uVar1;
  QVar5.w = (float32)(((float)p->w - fVar2) * (float)r + fVar2);
  QVar5.y = (float32)(((float)p->y - fVar4) * (float)r + fVar4);
  QVar5.x = (float32)(((float)p->x - (float)uVar3) * (float)r + (float)uVar3);
  return QVar5;
}

Assistant:

Quat
lerp(const Quat &q, const Quat &p, float32 r)
{
	float32 c;
	Quat q1 = q;
	c = dot(q1, p);
	if(c < 0.0f){
		c = -c;
		q1 = negate(q1);
	}
	return makeQuat(q1.w + r*(p.w - q1.w),
	                q1.x + r*(p.x - q1.x),
	                q1.y + r*(p.y - q1.y),
	                q1.z + r*(p.z - q1.z));
}